

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O3

bool burst::detail::
     collect_impl<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,int(*)[256],int*,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
               (uchar *first,uchar *last,int *param_3,int *param_4)

{
  int iVar1;
  anon_class_40_5_aef1ef96 __f;
  int iVar2;
  long lVar3;
  int iVar4;
  bool is_sorted;
  unsigned_long previous;
  bool local_74;
  undefined1 local_73;
  undefined1 local_72 [2];
  int **local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined8 *puStack_58;
  bool *local_50;
  undefined8 local_48;
  int *local_40;
  anon_class_40_5_aef1ef96 local_38;
  
  local_70 = &local_40;
  puStack_58 = &local_48;
  local_48 = 0;
  local_50 = &local_74;
  local_74 = true;
  puStack_68 = local_72;
  local_60 = &local_73;
  __f.map = (compose_fn<burst::shift_to_unsigned_fn,_burst::identity_fn> *)puStack_68;
  __f.counters = (int (**) [256])local_70;
  __f.radix = (low_byte_fn *)local_60;
  __f.previous = puStack_58;
  __f.is_sorted = local_50;
  local_40 = param_3;
  std::
  for_each<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,burst::detail::collect_impl<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,int(*)[256],int*,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>(__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,int(*)[256],int*,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>)::_lambda(auto:1_const&)_1_>
            (&local_38,first,last,__f);
  iVar2 = *local_40;
  lVar3 = 4;
  iVar4 = iVar2;
  do {
    iVar1 = *(int *)((long)local_40 + lVar3);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    iVar4 = iVar4 + iVar1;
    *(int *)((long)local_40 + lVar3) = iVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x400);
  *param_4 = iVar2;
  iVar2 = local_40[0x100];
  lVar3 = 0;
  iVar4 = iVar2;
  do {
    iVar1 = *(int *)((long)local_40 + lVar3 + 0x404);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    iVar4 = iVar4 + iVar1;
    *(int *)((long)local_40 + lVar3 + 0x404) = iVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x3fc);
  param_4[1] = iVar2;
  iVar2 = local_40[0x200];
  lVar3 = 0;
  iVar4 = iVar2;
  do {
    iVar1 = *(int *)((long)local_40 + lVar3 + 0x804);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    iVar4 = iVar4 + iVar1;
    *(int *)((long)local_40 + lVar3 + 0x804) = iVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x3fc);
  param_4[2] = iVar2;
  iVar2 = local_40[0x300];
  lVar3 = 0;
  iVar4 = iVar2;
  do {
    iVar1 = *(int *)((long)local_40 + lVar3 + 0xc04);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    iVar4 = iVar4 + iVar1;
    *(int *)((long)local_40 + lVar3 + 0xc04) = iVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x3fc);
  param_4[3] = iVar2;
  iVar2 = local_40[0x400];
  lVar3 = 0;
  iVar4 = iVar2;
  do {
    iVar1 = *(int *)((long)local_40 + lVar3 + 0x1004);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    iVar4 = iVar4 + iVar1;
    *(int *)((long)local_40 + lVar3 + 0x1004) = iVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x3fc);
  param_4[4] = iVar2;
  iVar2 = local_40[0x500];
  lVar3 = 0;
  iVar4 = iVar2;
  do {
    iVar1 = *(int *)((long)local_40 + lVar3 + 0x1404);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    iVar4 = iVar4 + iVar1;
    *(int *)((long)local_40 + lVar3 + 0x1404) = iVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x3fc);
  param_4[5] = iVar2;
  iVar2 = local_40[0x600];
  lVar3 = 0;
  iVar4 = iVar2;
  do {
    iVar1 = *(int *)((long)local_40 + lVar3 + 0x1804);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    iVar4 = iVar4 + iVar1;
    *(int *)((long)local_40 + lVar3 + 0x1804) = iVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x3fc);
  param_4[6] = iVar2;
  iVar2 = local_40[0x700];
  lVar3 = 0;
  iVar4 = iVar2;
  do {
    iVar1 = *(int *)((long)local_40 + lVar3 + 0x1c04);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    iVar4 = iVar4 + iVar1;
    *(int *)((long)local_40 + lVar3 + 0x1c04) = iVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x3fc);
  param_4[7] = iVar2;
  return local_74;
}

Assistant:

bool collect_impl (ForwardIterator first, ForwardIterator last, Map map, Radix radix, RandomAccessIterator1 counters, RandomAccessIterator2 maximums, std::index_sequence<Radices...>)
        {
            using value_type = iterator_value_t<ForwardIterator>;
            constexpr auto radix_value_range = radix_sort_traits<value_type, Map, Radix>::radix_value_range;

            auto previous = std::numeric_limits<invoke_result_t<Map, value_type>>::min();
            auto is_sorted = true;
            std::for_each(first, last,
                [& counters, & map, & radix, & previous, & is_sorted] (const auto & preimage)
                {
                    auto image = map(preimage);
                    is_sorted &= (image >= previous);
                    previous = image;

                    BURST_EXPAND_VARIADIC(++counters[Radices][nth_radix(Radices, radix)(image)]);
                });

            BURST_EXPAND_VARIADIC(maximums[Radices] = partial_sum_max(counters[Radices], counters[Radices] + radix_value_range, counters[Radices]).second);

            return is_sorted;
        }